

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferTests.cpp
# Opt level: O0

void __thiscall
vkt::sparse::anon_unknown_0::IndexBufferTestInstance::rendererDraw
          (IndexBufferTestInstance *this,VkPipelineLayout pipelineLayout,VkCommandBuffer cmdBuffer)

{
  VkDeviceSize VVar1;
  VkDeviceSize VVar2;
  VkCommandBuffer pVVar3;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *this_02;
  DeviceInterface *pDVar4;
  Handle<(vk::HandleType)8> *pHVar5;
  int iVar6;
  VkDeviceSize indexOffset;
  VkDeviceSize vertexOffset;
  DeviceInterface *vk;
  MessageBuilder local_1a0;
  VkCommandBuffer local_20;
  VkCommandBuffer cmdBuffer_local;
  IndexBufferTestInstance *this_local;
  VkPipelineLayout pipelineLayout_local;
  
  local_20 = cmdBuffer;
  cmdBuffer_local = (VkCommandBuffer)this;
  this_local = (IndexBufferTestInstance *)pipelineLayout.m_internal;
  this_00 = Context::getTestContext
                      ((this->super_DrawGridTestInstance).super_SparseBufferTestInstance.
                       super_SparseResourcesBaseInstance.super_TestInstance.m_context);
  this_01 = tcu::TestContext::getLog(this_00);
  tcu::TestLog::operator<<(&local_1a0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  this_02 = tcu::MessageBuilder::operator<<
                      (&local_1a0,
                       (char (*) [95])
                       "Drawing a grid of triangles from a sparse index buffer. There should be no red pixels visible."
                      );
  tcu::MessageBuilder::operator<<(this_02,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  pDVar4 = SparseResourcesBaseInstance::getDeviceInterface((SparseResourcesBaseInstance *)this);
  pVVar3 = local_20;
  indexOffset = 0;
  vertexOffset = (VkDeviceSize)pDVar4;
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::get
                     (&(this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  (*pDVar4->_vptr_DeviceInterface[0x58])(pDVar4,pVVar3,0,1,pHVar5,&indexOffset);
  pVVar3 = local_20;
  VVar1 = vertexOffset;
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     (&(this->super_DrawGridTestInstance).m_sparseBuffer.
                       super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  (**(code **)(*(long *)VVar1 + 0x2b8))(VVar1,pVVar3,pHVar5->m_internal,0,1);
  (**(code **)(*(long *)vertexOffset + 0x2d0))
            (vertexOffset,local_20,this->m_halfVertexCount,1,0,0,0);
  pVVar3 = local_20;
  VVar2 = vertexOffset;
  VVar1 = (this->super_DrawGridTestInstance).m_perDrawBufferOffset;
  iVar6 = 1;
  if (((this->super_DrawGridTestInstance).super_SparseBufferTestInstance.m_residency & 1U) != 0) {
    iVar6 = 2;
  }
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     (&(this->super_DrawGridTestInstance).m_sparseBuffer.
                       super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  (**(code **)(*(long *)VVar2 + 0x2b8))(VVar2,pVVar3,pHVar5->m_internal,VVar1 * (long)iVar6,1);
  (**(code **)(*(long *)vertexOffset + 0x2d0))
            (vertexOffset,local_20,this->m_halfVertexCount,1,0,0,0);
  return;
}

Assistant:

void rendererDraw (const VkPipelineLayout pipelineLayout, const VkCommandBuffer cmdBuffer) const
	{
		DE_UNREF(pipelineLayout);

		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Drawing a grid of triangles from a sparse index buffer. There should be no red pixels visible." << tcu::TestLog::EndMessage;

		const DeviceInterface&	vk				= getDeviceInterface();
		const VkDeviceSize		vertexOffset	= 0ull;
		VkDeviceSize			indexOffset		= 0ull;

		vk.cmdBindVertexBuffers	(cmdBuffer, 0u, 1u, &m_vertexBuffer.get(), &vertexOffset);

		vk.cmdBindIndexBuffer	(cmdBuffer, *m_sparseBuffer, indexOffset, VK_INDEX_TYPE_UINT32);
		vk.cmdDrawIndexed		(cmdBuffer, m_halfVertexCount, 1u, 0u, 0, 0u);

		indexOffset += m_perDrawBufferOffset * (m_residency ? 2 : 1);

		vk.cmdBindIndexBuffer	(cmdBuffer, *m_sparseBuffer, indexOffset, VK_INDEX_TYPE_UINT32);
		vk.cmdDrawIndexed		(cmdBuffer, m_halfVertexCount, 1u, 0u, 0, 0u);
	}